

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsRoberts_FSA_dns.c
# Opt level: O2

int main(int argc,char **argv)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  void *pvVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  size_t sVar9;
  char *extraout_RAX;
  FILE *pFVar10;
  char *pcVar11;
  char *__format;
  undefined8 uVar12;
  undefined4 uVar13;
  undefined8 unaff_R13;
  long lVar14;
  bool bVar15;
  int retval;
  int local_1c8;
  int retval_1;
  void *local_1c0;
  undefined8 *local_1b8;
  long *local_1b0;
  SUNContext sunctx;
  undefined4 local_19c;
  double local_198;
  void *local_190;
  int local_188;
  int qu;
  void *local_180;
  sunrealtype t;
  void *local_170;
  sunrealtype local_168;
  undefined8 local_160;
  char *local_158;
  char *pcStack_150;
  char *local_148;
  char fname [256];
  
  if (argc < 2) {
LAB_00102bda:
    WrongArgs(*argv);
    pcVar11 = extraout_RAX;
  }
  else {
    pcVar11 = argv[1];
    iVar2 = strcmp(pcVar11,"-nosensi");
    uVar12 = 0;
    uVar13 = (undefined4)CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
    if (iVar2 == 0) {
      iVar3 = -1;
      goto LAB_00102481;
    }
    iVar3 = strcmp(pcVar11,"-sensi");
    if ((iVar3 != 0) || (argc != 4)) goto LAB_00102bda;
    pcVar11 = argv[2];
    iVar3 = strcmp(pcVar11,"sim");
    if (iVar3 == 0) {
      iVar3 = 1;
    }
    else {
      iVar3 = strcmp(pcVar11,"stg");
      if (iVar3 == 0) {
        iVar3 = 2;
      }
      else {
        iVar3 = strcmp(pcVar11,"stg1");
        if (iVar3 != 0) goto LAB_00102bda;
        iVar3 = 3;
      }
    }
    pcVar11 = argv[3];
    if (*pcVar11 == 'f') {
      if (pcVar11[1] != '\0') goto LAB_00102bda;
    }
    else {
      if ((*pcVar11 != 't') || (pcVar11[1] != '\0')) goto LAB_00102bda;
      uVar12 = 1;
      uVar13 = 0;
    }
LAB_00102481:
    argv = (char **)malloc(0x18);
    iVar4 = check_retval(argv,"malloc",2);
    if (iVar4 != 0) {
      return 1;
    }
    *(undefined4 *)argv = 0x47ae147b;
    *(undefined4 *)((long)argv + 4) = 0x3fa47ae1;
    *(undefined4 *)(argv + 1) = 0;
    *(undefined4 *)((long)argv + 0xc) = 0x40c38800;
    argv[2] = (char *)0x417c9c3800000000;
    local_19c = uVar13;
    retval = SUNContext_Create(0,&sunctx);
    iVar4 = check_retval(&retval,"SUNContext_Create",1);
    if (iVar4 != 0) {
      return 1;
    }
    plVar5 = (long *)N_VNew_Serial(3,sunctx);
    iVar4 = check_retval(plVar5,"N_VNew_Serial",0);
    if (iVar4 != 0) {
      return 1;
    }
    puVar7 = *(undefined8 **)(*plVar5 + 0x10);
    *puVar7 = 0x3ff0000000000000;
    puVar7[1] = 0;
    puVar7[2] = 0;
    local_1c8 = iVar3;
    pvVar6 = (void *)CVodeCreate(2,sunctx);
    local_190 = pvVar6;
    iVar3 = check_retval(pvVar6,"CVodeCreate",0);
    if (iVar3 != 0) {
      return 1;
    }
    retval = CVodeInit(0,pvVar6,f,plVar5);
    iVar3 = check_retval(&retval,"CVodeInit",1);
    if (iVar3 != 0) {
      return 1;
    }
    retval = CVodeWFtolerances(pvVar6,ewt);
    iVar3 = check_retval(&retval,"CVodeWFtolerances",1);
    if (iVar3 != 0) {
      return 1;
    }
    local_1b0 = plVar5;
    retval = CVodeSetUserData(pvVar6,argv);
    iVar3 = check_retval(&retval,"CVodeSetUserData",1);
    if (iVar3 != 0) {
      return 1;
    }
    local_1c0 = pvVar6;
    pvVar6 = (void *)SUNDenseMatrix(3,3,sunctx);
    iVar3 = check_retval(pvVar6,"SUNDenseMatrix",0);
    if (iVar3 != 0) {
      return 1;
    }
    local_180 = (void *)SUNLinSol_Dense(local_1b0,pvVar6,sunctx);
    iVar3 = check_retval(local_180,"SUNLinSol_Dense",0);
    pvVar1 = local_1c0;
    if (iVar3 != 0) {
      return 1;
    }
    retval = CVodeSetLinearSolver(local_1c0,local_180,pvVar6);
    iVar3 = check_retval(&retval,"CVodeSetLinearSolver",1);
    if (iVar3 != 0) {
      return 1;
    }
    local_170 = pvVar6;
    retval = CVodeSetJacFn(pvVar1,Jac);
    iVar3 = check_retval(&retval,"CVodeSetJacFn",1);
    if (iVar3 != 0) {
      return 1;
    }
    puts(" \n3-species kinetics problem");
    if (iVar2 == 0) {
      local_1b8 = (undefined8 *)0x0;
      pcVar11 = "Sensitivity: NO ";
    }
    else {
      local_158 = *argv;
      pcStack_150 = argv[1];
      local_148 = argv[2];
      local_1b8 = (undefined8 *)N_VCloneVectorArray(3,local_1b0);
      iVar3 = check_retval(local_1b8,"N_VCloneVectorArray",0);
      puVar7 = local_1b8;
      if (iVar3 != 0) {
        return 1;
      }
      for (lVar14 = 0; pvVar6 = local_1c0, lVar14 != 3; lVar14 = lVar14 + 1) {
        N_VConst(0,puVar7[lVar14]);
      }
      retval = CVodeSensInit1(local_1c0,3,local_1c8,fS,puVar7);
      iVar3 = check_retval(&retval,"CVodeSensInit",1);
      if (iVar3 != 0) {
        return 1;
      }
      retval = CVodeSensEEtolerances(pvVar6);
      iVar3 = check_retval(&retval,"CVodeSensEEtolerances",1);
      if (iVar3 != 0) {
        return 1;
      }
      retval = CVodeSetSensErrCon(pvVar6,uVar12);
      iVar3 = check_retval(&retval,"CVodeSetSensErrCon",1);
      if (iVar3 != 0) {
        return 1;
      }
      retval = CVodeSetSensParams(pvVar6,0,&local_158,0);
      iVar3 = check_retval(&retval,"CVodeSetSensParams",1);
      if (iVar3 != 0) {
        return 1;
      }
      printf("Sensitivity: YES ");
      pcVar11 = "( STAGGERED1 +";
      if (local_1c8 == 2) {
        pcVar11 = "( STAGGERED +";
      }
      __format = "( SIMULTANEOUS +";
      if (local_1c8 != 1) {
        __format = pcVar11;
      }
      printf(__format);
      pcVar11 = " FULL ERROR CONTROL )";
      if ((char)local_19c != '\0') {
        pcVar11 = " PARTIAL ERROR CONTROL )";
      }
    }
    printf(pcVar11);
    puts("\n");
    printf("===========================================");
    puts("============================");
    printf("     T     Q       H      NST           y1");
    puts("           y2           y3    ");
    printf("===========================================");
    puts("============================");
    local_198 = 0.4;
    local_188 = 0xc;
    while (plVar5 = local_1b0, bVar15 = local_188 != 0, local_188 = local_188 + -1, bVar15) {
      retval = CVode(SUB84(local_198,0),local_1c0,local_1b0,&t,1);
      iVar3 = check_retval(&retval,"CVode",1);
      if (iVar3 != 0) break;
      local_168 = t;
      puVar7 = (undefined8 *)N_VGetArrayPointer(plVar5);
      pvVar6 = local_1c0;
      retval_1 = CVodeGetNumSteps(local_1c0,fname);
      check_retval(&retval_1,"CVodeGetNumSteps",1);
      retval_1 = CVodeGetLastOrder(pvVar6,&qu);
      check_retval(&retval_1,"CVodeGetLastOrder",1);
      retval_1 = CVodeGetLastStep(pvVar6,&local_160);
      check_retval(&retval_1,"CVodeGetLastStep",1);
      printf("%8.3e %2d  %8.3e %5ld\n",SUB84(local_168,0),local_160,(ulong)(uint)qu,fname._0_8_);
      printf("                  Solution       ");
      printf("%12.4e %12.4e %12.4e \n",(int)*puVar7,puVar7[1],puVar7[2]);
      if (iVar2 != 0) {
        retval = CVodeGetSens(local_1c0,&t,local_1b8);
        iVar3 = check_retval(&retval,"CVodeGetSens",1);
        puVar7 = local_1b8;
        if (iVar3 != 0) break;
        puVar8 = (undefined8 *)N_VGetArrayPointer(*local_1b8);
        printf("                  Sensitivity 1  ");
        printf("%12.4e %12.4e %12.4e \n",(int)*puVar8,puVar8[1],puVar8[2]);
        puVar8 = (undefined8 *)N_VGetArrayPointer(puVar7[1]);
        printf("                  Sensitivity 2  ");
        printf("%12.4e %12.4e %12.4e \n",(int)*puVar8,puVar8[1],puVar8[2]);
        puVar7 = (undefined8 *)N_VGetArrayPointer(puVar7[2]);
        printf("                  Sensitivity 3  ");
        printf("%12.4e %12.4e %12.4e \n",(int)*puVar7,puVar7[1],puVar7[2]);
      }
      printf("-----------------------------------------");
      puts("------------------------------");
      local_198 = local_198 * 10.0;
    }
    puts("\nFinal Statistics:");
    retval = CVodePrintAllStats(local_1c0,_stdout,0);
    builtin_strncpy(fname,"cvsRoberts_FSA_dns_stats",0x19);
    sVar9 = strlen(fname);
    pcVar11 = fname + sVar9;
    if (iVar2 != 0) {
      if (local_1c8 == 2) {
        builtin_strncpy(fname + sVar9,"_-sensi_stg",0xc);
      }
      else if (local_1c8 == 1) {
        builtin_strncpy(fname + sVar9,"_-sensi_sim",0xc);
      }
      else {
        builtin_strncpy(fname + sVar9,"_-sensi_stg1",0xd);
      }
      sVar9 = strlen(fname);
      pcVar11 = fname + sVar9;
      if ((char)local_19c == '\0') {
        fname[sVar9 + 2] = '\0';
        pcVar11[0] = '_';
        pcVar11[1] = 't';
      }
      else {
        fname[sVar9 + 2] = '\0';
        pcVar11[0] = '_';
        pcVar11[1] = 'f';
      }
      sVar9 = strlen(fname);
      builtin_strncpy(fname + sVar9,".csv",5);
      pFVar10 = fopen(fname,"w");
      retval = CVodePrintAllStats(local_190,pFVar10,1);
      fclose(pFVar10);
      N_VDestroy(local_1b0);
      N_VDestroyVectorArray(local_1b8,3);
      goto LAB_00102cf8;
    }
  }
  builtin_strncpy(pcVar11,".csv",5);
  pFVar10 = fopen(fname,"w");
  retval = CVodePrintAllStats(local_190,pFVar10,1);
  fclose(pFVar10);
  N_VDestroy(local_1b0);
LAB_00102cf8:
  free(argv);
  CVodeFree(&local_190);
  SUNLinSolFree(local_180);
  SUNMatDestroy(local_170);
  SUNContext_Free(&sunctx);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
  SUNContext sunctx;
  sunrealtype t, tout;
  N_Vector y;
  SUNMatrix A;
  SUNLinearSolver LS;
  void* cvode_mem;
  int retval, iout;
  UserData data;
  FILE* FID;
  char fname[256];

  sunrealtype pbar[NS];
  int is;
  N_Vector* yS;
  sunbooleantype sensi, err_con;
  int sensi_meth;

  data      = NULL;
  y         = NULL;
  yS        = NULL;
  A         = NULL;
  LS        = NULL;
  cvode_mem = NULL;

  /* Process arguments */
  ProcessArgs(argc, argv, &sensi, &sensi_meth, &err_con);

  /* User data structure */
  data = (UserData)malloc(sizeof *data);
  if (check_retval((void*)data, "malloc", 2)) { return (1); }

  /* Initialize sensitivity variables (reaction rates for this problem) */
  data->p[0] = SUN_RCONST(0.04);
  data->p[1] = SUN_RCONST(1.0e4);
  data->p[2] = SUN_RCONST(3.0e7);

  /* Create the SUNDIALS context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Initial conditions */
  y = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }

  /* Initialize y */
  Ith(y, 1) = Y1;
  Ith(y, 2) = Y2;
  Ith(y, 3) = Y3;

  /* Call CVodeCreate to create the solver memory and specify the
   * Backward Differentiation Formula */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Call CVodeInit to initialize the integrator memory and specify the
   * user's right hand side function in y'=f(t,y), the initial time T0, and
   * the initial dependent variable vector y. */
  retval = CVodeInit(cvode_mem, f, T0, y);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Call CVodeWFtolerances to specify a user-supplied function ewt that sets
   * the multiplicative error weights w_i for use in the weighted RMS norm */
  retval = CVodeWFtolerances(cvode_mem, ewt);
  if (check_retval(&retval, "CVodeWFtolerances", 1)) { return (1); }

  /* Attach user data */
  retval = CVodeSetUserData(cvode_mem, data);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, sunctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(y, A, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

  /* Set the user-supplied Jacobian routine Jac */
  retval = CVodeSetJacFn(cvode_mem, Jac);
  if (check_retval(&retval, "CVodeSetJacFn", 1)) { return (1); }

  printf(" \n3-species kinetics problem\n");

  /* Sensitivity-related settings */
  if (sensi)
  {
    /* Set parameter scaling factor */
    pbar[0] = data->p[0];
    pbar[1] = data->p[1];
    pbar[2] = data->p[2];

    /* Set sensitivity initial conditions */
    yS = N_VCloneVectorArray(NS, y);
    if (check_retval((void*)yS, "N_VCloneVectorArray", 0)) { return (1); }
    for (is = 0; is < NS; is++) { N_VConst(ZERO, yS[is]); }

    /* Call CVodeSensInit1 to activate forward sensitivity computations
     * and allocate internal memory for COVEDS related to sensitivity
     * calculations. Computes the right-hand sides of the sensitivity
     * ODE, one at a time */
    retval = CVodeSensInit1(cvode_mem, NS, sensi_meth, fS, yS);
    if (check_retval(&retval, "CVodeSensInit", 1)) { return (1); }

    /* Call CVodeSensEEtolerances to estimate tolerances for sensitivity
     * variables based on the rolerances supplied for states variables and
     * the scaling factor pbar */
    retval = CVodeSensEEtolerances(cvode_mem);
    if (check_retval(&retval, "CVodeSensEEtolerances", 1)) { return (1); }

    /* Set sensitivity analysis optional inputs */
    /* Call CVodeSetSensErrCon to specify the error control strategy for
     * sensitivity variables */
    retval = CVodeSetSensErrCon(cvode_mem, err_con);
    if (check_retval(&retval, "CVodeSetSensErrCon", 1)) { return (1); }

    /* Call CVodeSetSensParams to specify problem parameter information for
     * sensitivity calculations */
    retval = CVodeSetSensParams(cvode_mem, NULL, pbar, NULL);
    if (check_retval(&retval, "CVodeSetSensParams", 1)) { return (1); }

    printf("Sensitivity: YES ");
    if (sensi_meth == CV_SIMULTANEOUS) { printf("( SIMULTANEOUS +"); }
    else if (sensi_meth == CV_STAGGERED) { printf("( STAGGERED +"); }
    else { printf("( STAGGERED1 +"); }
    if (err_con) { printf(" FULL ERROR CONTROL )"); }
    else { printf(" PARTIAL ERROR CONTROL )"); }
  }
  else { printf("Sensitivity: NO "); }

  /* In loop, call CVode, print results, and test for error.
     Break out of loop when NOUT preset output times have been reached.  */

  printf("\n\n");
  printf("===========================================");
  printf("============================\n");
  printf("     T     Q       H      NST           y1");
  printf("           y2           y3    \n");
  printf("===========================================");
  printf("============================\n");

  for (iout = 1, tout = T1; iout <= NOUT; iout++, tout *= TMULT)
  {
    retval = CVode(cvode_mem, tout, y, &t, CV_NORMAL);
    if (check_retval(&retval, "CVode", 1)) { break; }

    PrintOutput(cvode_mem, t, y);

    /* Call CVodeGetSens to get the sensitivity solution vector after a
     * successful return from CVode */
    if (sensi)
    {
      retval = CVodeGetSens(cvode_mem, &t, yS);
      if (check_retval(&retval, "CVodeGetSens", 1)) { break; }
      PrintOutputS(yS);
    }
    printf("-----------------------------------------");
    printf("------------------------------\n");
  }

  /* Print final statistics to the screen */
  printf("\nFinal Statistics:\n");
  retval = CVodePrintAllStats(cvode_mem, stdout, SUN_OUTPUTFORMAT_TABLE);

  /* Print final statistics to a file in CSV format */
  strcpy(fname, "cvsRoberts_FSA_dns_stats");
  if (sensi)
  {
    if (sensi_meth == CV_SIMULTANEOUS) { strcat(fname, "_-sensi_sim"); }
    else if (sensi_meth == CV_STAGGERED) { strcat(fname, "_-sensi_stg"); }
    else { strcat(fname, "_-sensi_stg1"); }
    if (err_con) { strcat(fname, "_t"); }
    else { strcat(fname, "_f"); }
  }
  strcat(fname, ".csv");
  FID    = fopen(fname, "w");
  retval = CVodePrintAllStats(cvode_mem, FID, SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* Free memory */
  N_VDestroy(y); /* Free y vector */
  if (sensi) { N_VDestroyVectorArray(yS, NS); /* Free yS vector */ }
  free(data);               /* Free user data */
  CVodeFree(&cvode_mem);    /* Free CVODES memory */
  SUNLinSolFree(LS);        /* Free the linear solver memory */
  SUNMatDestroy(A);         /* Free the matrix memory */
  SUNContext_Free(&sunctx); /* Free the SUNDIALS context */

  return (0);
}